

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_functional_test.cc
# Opt level: O0

void iterator_offset_access_test(void)

{
  fdb_status fVar1;
  size_t sVar2;
  void *pvVar3;
  undefined7 in_stack_ffffffffffffdc78;
  fdb_iterator_seek_opt_t in_stack_ffffffffffffdc7f;
  void *in_stack_ffffffffffffdc80;
  fdb_iterator *in_stack_ffffffffffffdc88;
  fdb_iterator *in_stack_ffffffffffffdc90;
  size_t in_stack_ffffffffffffdc98;
  void *in_stack_ffffffffffffdca0;
  fdb_kvs_handle *in_stack_ffffffffffffdca8;
  void *in_stack_ffffffffffffdcb0;
  fdb_kvs_handle *in_stack_ffffffffffffdcb8;
  fdb_doc *in_stack_ffffffffffffdcd0;
  fdb_kvs_handle *in_stack_ffffffffffffdcd8;
  fdb_doc *in_stack_ffffffffffffdce0;
  fdb_kvs_handle *in_stack_ffffffffffffdce8;
  fdb_doc **in_stack_ffffffffffffdcf0;
  fdb_iterator *in_stack_ffffffffffffdcf8;
  fdb_kvs_config *in_stack_ffffffffffffde20;
  char *in_stack_ffffffffffffde28;
  fdb_kvs_handle **in_stack_ffffffffffffde30;
  fdb_file_handle *in_stack_ffffffffffffde38;
  fdb_config *in_stack_ffffffffffffde98;
  char *in_stack_ffffffffffffdea0;
  fdb_file_handle **in_stack_ffffffffffffdea8;
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  fdb_iterator *it;
  fdb_status s;
  fdb_doc *rdoc;
  fdb_doc **doc;
  fdb_kvs_handle *o_db;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  char bodybuf [256];
  char keybuf [256];
  int n;
  int r;
  int i;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  
  gettimeofday((timeval *)&__test_prev.tv_usec,(__timezone_ptr_t)0x0);
  memleak_start();
  system("rm -rf  iterator_test* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fconfig.buffercache_size = 0x200;
  fconfig.chunksize = 0x1000;
  fconfig._2_2_ = 0;
  fconfig.blocksize = 0;
  fconfig.purging_interval = 1;
  fconfig.flags._2_1_ = 0;
  fconfig.wal_threshold._4_4_ = 1;
  fVar1 = fdb_open(in_stack_ffffffffffffdea8,in_stack_ffffffffffffdea0,in_stack_ffffffffffffde98);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xedb);
    iterator_offset_access_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xedb,"void iterator_offset_access_test()");
    }
  }
  fVar1 = fdb_kvs_open(in_stack_ffffffffffffde38,in_stack_ffffffffffffde30,in_stack_ffffffffffffde28
                       ,in_stack_ffffffffffffde20);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xedd);
    iterator_offset_access_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xedd,"void iterator_offset_access_test()");
    }
  }
  fVar1 = fdb_kvs_open(in_stack_ffffffffffffde38,in_stack_ffffffffffffde30,in_stack_ffffffffffffde28
                       ,in_stack_ffffffffffffde20);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xedf);
    iterator_offset_access_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xedf,"void iterator_offset_access_test()");
    }
  }
  n = 0;
  do {
    if (999 < n) {
      fVar1 = fdb_commit((fdb_file_handle *)
                         CONCAT17(in_stack_ffffffffffffdc7f,in_stack_ffffffffffffdc78),'\0');
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                ,0xef1);
        iterator_offset_access_test::__test_pass = 0;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          __assert_fail("s == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                        ,0xef1,"void iterator_offset_access_test()");
        }
      }
      n = 0xfa;
      do {
        if (499 < n) {
          n = 0;
          do {
            if (0xf9 < n) {
              fVar1 = fdb_commit((fdb_file_handle *)
                                 CONCAT17(in_stack_ffffffffffffdc7f,in_stack_ffffffffffffdc78),'\0')
              ;
              if (fVar1 != FDB_RESULT_SUCCESS) {
                fprintf(_stderr,"Test failed: %s %d\n",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                        ,0xf05);
                iterator_offset_access_test::__test_pass = 0;
                if (fVar1 != FDB_RESULT_SUCCESS) {
                  __assert_fail("s == FDB_RESULT_SUCCESS",
                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                                ,0xf05,"void iterator_offset_access_test()");
                }
              }
              fdb_iterator_init((fdb_kvs_handle *)doc,(fdb_iterator **)&fconfig.num_blocks_readahead
                                ,(void *)0x0,0,(void *)0x0,0,2);
              n = 500;
              do {
                if (999 < n) {
                  fdb_iterator_close(in_stack_ffffffffffffdc88);
                  fVar1 = fdb_commit((fdb_file_handle *)
                                     CONCAT17(in_stack_ffffffffffffdc7f,in_stack_ffffffffffffdc78),
                                     '\0');
                  if (fVar1 != FDB_RESULT_SUCCESS) {
                    fprintf(_stderr,"Test failed: %s %d\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                            ,0xf22);
                    iterator_offset_access_test::__test_pass = 0;
                    if (fVar1 != FDB_RESULT_SUCCESS) {
                      __assert_fail("s == FDB_RESULT_SUCCESS",
                                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                                    ,0xf22,"void iterator_offset_access_test()");
                    }
                  }
                  n = 0;
                  do {
                    if (0xf9 < n) {
                      n = 500;
                      do {
                        if (999 < n) {
                          for (n = 0; n < 1000; n = n + 1) {
                            fdb_doc_free((fdb_doc *)0x11f5ff);
                          }
                          fdb_doc_free((fdb_doc *)0x11f616);
                          fdb_close((fdb_file_handle *)
                                    CONCAT17(in_stack_ffffffffffffdc7f,in_stack_ffffffffffffdc78));
                          fdb_shutdown();
                          memleak_end();
                          if (iterator_offset_access_test::__test_pass == 0) {
                            fprintf(_stderr,"%s FAILED\n","iterator offset access test");
                          }
                          else {
                            fprintf(_stderr,"%s PASSED\n","iterator offset access test");
                          }
                          return;
                        }
                        fVar1 = fdb_get_byoffset(in_stack_ffffffffffffdce8,in_stack_ffffffffffffdce0
                                                );
                        if (fVar1 != FDB_RESULT_KEY_NOT_FOUND) {
                          fprintf(_stderr,"Test failed: %s %d\n",
                                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                                  ,0xf31);
                          iterator_offset_access_test::__test_pass = 0;
                          if (fVar1 != FDB_RESULT_KEY_NOT_FOUND) {
                            __assert_fail("s == FDB_RESULT_KEY_NOT_FOUND",
                                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                                          ,0xf31,"void iterator_offset_access_test()");
                          }
                        }
                        if ((*(byte *)(*(long *)(&stack0xffffffffffffdc78 + (long)n * 8) + 0x48) & 1
                            ) != 1) {
                          fprintf(_stderr,"Test failed: %s %d\n",
                                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                                  ,0xf34);
                          iterator_offset_access_test::__test_pass = 0;
                          if ((*(byte *)(*(long *)(&stack0xffffffffffffdc78 + (long)n * 8) + 0x48) &
                              1) != 1) {
                            __assert_fail("doc[i]->deleted == true",
                                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                                          ,0xf34,"void iterator_offset_access_test()");
                          }
                        }
                        n = n + 10;
                      } while( true );
                    }
                    sprintf(bodybuf + 0xf8,"k1y%d",(ulong)(uint)n);
                    sprintf((char *)&dbfile,"b1dy%d",(ulong)(uint)n);
                    strlen(bodybuf + 0xf8);
                    strlen((char *)&dbfile);
                    fVar1 = fdb_set_kv(in_stack_ffffffffffffdcb8,in_stack_ffffffffffffdcb0,
                                       (size_t)in_stack_ffffffffffffdca8,in_stack_ffffffffffffdca0,
                                       in_stack_ffffffffffffdc98);
                    if (fVar1 != FDB_RESULT_SUCCESS) {
                      fprintf(_stderr,"Test failed: %s %d\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                              ,0xf29);
                      iterator_offset_access_test::__test_pass = 0;
                      if (fVar1 != FDB_RESULT_SUCCESS) {
                        __assert_fail("s == FDB_RESULT_SUCCESS",
                                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                                      ,0xf29,"void iterator_offset_access_test()");
                      }
                    }
                    n = n + 1;
                  } while( true );
                }
                fVar1 = fdb_get_byoffset(in_stack_ffffffffffffdce8,in_stack_ffffffffffffdce0);
                if (fVar1 != FDB_RESULT_SUCCESS) {
                  fprintf(_stderr,"Test failed: %s %d\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                          ,0xf0f);
                  iterator_offset_access_test::__test_pass = 0;
                  if (fVar1 != FDB_RESULT_SUCCESS) {
                    __assert_fail("s == FDB_RESULT_SUCCESS",
                                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                                  ,0xf0f,"void iterator_offset_access_test()");
                  }
                }
                fVar1 = fdb_iterator_seek(in_stack_ffffffffffffdc90,in_stack_ffffffffffffdc88,
                                          (size_t)in_stack_ffffffffffffdc80,
                                          in_stack_ffffffffffffdc7f);
                if (fVar1 != FDB_RESULT_SUCCESS) {
                  fprintf(_stderr,"Test failed: %s %d\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                          ,0xf13);
                  iterator_offset_access_test::__test_pass = 0;
                  if (fVar1 != FDB_RESULT_SUCCESS) {
                    __assert_fail("s == FDB_RESULT_SUCCESS",
                                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                                  ,0xf13,"void iterator_offset_access_test()");
                  }
                }
                fVar1 = fdb_iterator_get(in_stack_ffffffffffffdcf8,in_stack_ffffffffffffdcf0);
                if (fVar1 != FDB_RESULT_SUCCESS) {
                  fprintf(_stderr,"Test failed: %s %d\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                          ,0xf15);
                  iterator_offset_access_test::__test_pass = 0;
                  if (fVar1 != FDB_RESULT_SUCCESS) {
                    __assert_fail("s == FDB_RESULT_SUCCESS",
                                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                                  ,0xf15,"void iterator_offset_access_test()");
                  }
                }
                if (*plRam0000000000000040 !=
                    *(long *)(*(long *)(&stack0xffffffffffffdc78 + (long)n * 8) + 0x30)) {
                  fprintf(_stderr,"Test failed: %s %d\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                          ,0xf16);
                  iterator_offset_access_test::__test_pass = 0;
                  if (*plRam0000000000000040 !=
                      *(long *)(*(long *)(&stack0xffffffffffffdc78 + (long)n * 8) + 0x30)) {
                    __assert_fail("*((uint64_t *)rdoc->body) == doc[i]->offset",
                                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                                  ,0xf16,"void iterator_offset_access_test()");
                  }
                }
                fVar1 = fdb_del(in_stack_ffffffffffffdcd8,in_stack_ffffffffffffdcd0);
                if (fVar1 != FDB_RESULT_SUCCESS) {
                  fprintf(_stderr,"Test failed: %s %d\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                          ,0xf1a);
                  iterator_offset_access_test::__test_pass = 0;
                  if (fVar1 != FDB_RESULT_SUCCESS) {
                    __assert_fail("s == FDB_RESULT_SUCCESS",
                                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                                  ,0xf1a,"void iterator_offset_access_test()");
                  }
                }
                fdb_get_metaonly(o_db,*(fdb_doc **)(&stack0xffffffffffffdc78 + (long)n * 8));
                n = n + 10;
              } while( true );
            }
            sprintf(bodybuf + 0xf8,"k0y%d",(ulong)(uint)n);
            sprintf((char *)&dbfile,"b0dy%d",(ulong)(uint)n);
            fdb_doc_free((fdb_doc *)0x11ee20);
            strlen(bodybuf + 0xf8);
            pvVar3 = (void *)0x11ee74;
            sVar2 = strlen((char *)&dbfile);
            fdb_doc_create((fdb_doc **)in_stack_ffffffffffffdc88,in_stack_ffffffffffffdc80,
                           CONCAT17(in_stack_ffffffffffffdc7f,in_stack_ffffffffffffdc78),pvVar3,
                           sVar2,(void *)0x11eea5,(size_t)in_stack_ffffffffffffdca0);
            fVar1 = fdb_set(o_db,*(fdb_doc **)(&stack0xffffffffffffdc78 + (long)n * 8));
            if (fVar1 != FDB_RESULT_SUCCESS) {
              fprintf(_stderr,"Test failed: %s %d\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                      ,0xf01);
              iterator_offset_access_test::__test_pass = 0;
              if (fVar1 != FDB_RESULT_SUCCESS) {
                __assert_fail("s == FDB_RESULT_SUCCESS",
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                              ,0xf01,"void iterator_offset_access_test()");
              }
            }
            n = n + 1;
          } while( true );
        }
        sprintf(bodybuf + 0xf8,"key%d",(ulong)(uint)n);
        strlen(bodybuf + 0xf8);
        fVar1 = fdb_del_kv(in_stack_ffffffffffffdca8,in_stack_ffffffffffffdca0,
                           in_stack_ffffffffffffdc98);
        if (fVar1 != FDB_RESULT_SUCCESS) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0xef6);
          iterator_offset_access_test::__test_pass = 0;
          if (fVar1 != FDB_RESULT_SUCCESS) {
            __assert_fail("s == FDB_RESULT_SUCCESS",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                          ,0xef6,"void iterator_offset_access_test()");
          }
        }
        n = n + 1;
      } while( true );
    }
    sprintf(bodybuf + 0xf8,"key%d",(ulong)(uint)n);
    sprintf((char *)&dbfile,"body%d",(ulong)(uint)n);
    strlen(bodybuf + 0xf8);
    pvVar3 = (void *)0x11eaad;
    sVar2 = strlen((char *)&dbfile);
    fdb_doc_create((fdb_doc **)in_stack_ffffffffffffdc88,in_stack_ffffffffffffdc80,
                   CONCAT17(in_stack_ffffffffffffdc7f,in_stack_ffffffffffffdc78),pvVar3,sVar2,
                   (void *)0x11eade,(size_t)in_stack_ffffffffffffdca0);
    fVar1 = fdb_set(o_db,*(fdb_doc **)(&stack0xffffffffffffdc78 + (long)n * 8));
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0xee8);
      iterator_offset_access_test::__test_pass = 0;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        __assert_fail("s == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                      ,0xee8,"void iterator_offset_access_test()");
      }
    }
    strlen(bodybuf + 0xf8);
    fVar1 = fdb_set_kv(in_stack_ffffffffffffdcb8,in_stack_ffffffffffffdcb0,
                       (size_t)in_stack_ffffffffffffdca8,in_stack_ffffffffffffdca0,
                       in_stack_ffffffffffffdc98);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0xeed);
      iterator_offset_access_test::__test_pass = 0;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        __assert_fail("s == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                      ,0xeed,"void iterator_offset_access_test()");
      }
    }
    n = n + 1;
  } while( true );
}

Assistant:

void iterator_offset_access_test()
{
    TEST_INIT();
    memleak_start();


    int i, r;
    int n = 1000;
    char keybuf[256], bodybuf[256];
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db, *o_db;
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc *rdoc = NULL;
    fdb_status s;
    fdb_iterator *it;

    // remove  all previous iterator_test files
    r = system(SHELL_DEL" iterator_test* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.wal_threshold = 512;
    fconfig.buffercache_size = 4096;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_mode = FDB_COMPACTION_MANUAL;
    fconfig.purging_interval = 1; // retain deletes until compaction

    // open db
    s = fdb_open(&dbfile, "./iterator_test1", &fconfig);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_kvs_open(dbfile, &db, "DB", &kvs_config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_kvs_open(dbfile, &o_db,"ODB", &kvs_config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // set docs
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            NULL, 0, (void*)bodybuf, strlen(bodybuf));
        s = fdb_set(db, doc[i]);
        TEST_CHK(s == FDB_RESULT_SUCCESS);

        // set in offset verification index
        s = fdb_set_kv(o_db, keybuf, strlen(keybuf),
                        &doc[i]->offset, sizeof(uint64_t));
        TEST_CHK(s == FDB_RESULT_SUCCESS);
    }

    s = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    // delete some
     for (i=n/4;i<n/2;++i){
        sprintf(keybuf, "key%d", i);
        s = fdb_del_kv(db, (void*)keybuf, strlen(keybuf));
        TEST_CHK(s == FDB_RESULT_SUCCESS);
    }

    // update initial n/4 docs
    for (i=0;i<n/4;++i){
        sprintf(keybuf, "k0y%d", i);
        sprintf(bodybuf, "b0dy%d", i);
        fdb_doc_free(doc[i]);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            NULL, 0, (void*)bodybuf, strlen(bodybuf));
        s = fdb_set(db, doc[i]);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
    }

    s = fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // create iterator with no deletes
    fdb_iterator_init(o_db, &it, NULL, 0, NULL, 0, FDB_ITR_NO_DELETES);

    // only 2nd half of docs should exist at original offset
    for (i=n/2;i<n;i+=10){

        // get by offset
        s = fdb_get_byoffset(db, doc[i]);
        TEST_CHK(s == FDB_RESULT_SUCCESS);

        // seek to in verificaiton db
        s = fdb_iterator_seek(it, doc[i]->key, doc[i]->keylen, 0);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        s = fdb_iterator_get(it, &rdoc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CHK(*((uint64_t *)rdoc->body) == doc[i]->offset);

        // delete
        s = fdb_del(db, doc[i]);
        TEST_CHK(s == FDB_RESULT_SUCCESS);

        // track new offset storing in doc[i]
        fdb_get_metaonly(db, doc[i]);
    }

    fdb_iterator_close(it);
    s = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // do some sets passed recorded offset
    for (i=0;i<n/4;++i){
        sprintf(keybuf, "k1y%d", i);
        sprintf(bodybuf, "b1dy%d", i);
        s = fdb_set_kv(db, keybuf, strlen(keybuf), bodybuf, strlen(bodybuf));
        TEST_CHK(s == FDB_RESULT_SUCCESS);
    }

    // known offsets exist between n/2 - n
    for (i=n/2;i<n;i+=10){

        // verify can get by offset from main db
        s = fdb_get_byoffset(db, doc[i]);
        TEST_CHK(s == FDB_RESULT_KEY_NOT_FOUND);

        // should be deleted now at new offset
        TEST_CHK(doc[i]->deleted == true);
    }

    for(i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    fdb_doc_free(rdoc);
    fdb_close(dbfile);
    fdb_shutdown();

    memleak_end();
    TEST_RESULT("iterator offset access test");
}